

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_Vx_annotation.cpp
# Opt level: O2

ON_Annotation *
ON_Annotation::CreateFromV5Annotation
          (ON_OBSOLETE_V5_Annotation *V5_annotation,ON_3dmAnnotationContext *annotation_context)

{
  ON_OBSOLETE_V5_TextObject *V5_text_object;
  ON_Annotation *pOVar1;
  ON_OBSOLETE_V5_Leader *V5_leader;
  ON_Leader *pOVar2;
  ON_OBSOLETE_V5_DimLinear *V5_dim_linear;
  ON_DimLinear *pOVar3;
  ON_OBSOLETE_V5_DimAngular *V5_dim_angle;
  ON_DimAngular *pOVar4;
  ON_OBSOLETE_V5_DimRadial *V5_radial_dimension;
  ON_DimRadial *pOVar5;
  ON_OBSOLETE_V5_DimOrdinate *v5_dim_ordinate;
  ON_DimOrdinate *pOVar6;
  
  V5_text_object = ON_OBSOLETE_V5_TextObject::Cast((ON_Object *)V5_annotation);
  if (V5_text_object != (ON_OBSOLETE_V5_TextObject *)0x0) {
    pOVar1 = &ON_Text::CreateFromV5TextObject(V5_text_object,annotation_context,(ON_Text *)0x0)->
              super_ON_Annotation;
    return pOVar1;
  }
  V5_leader = ON_OBSOLETE_V5_Leader::Cast((ON_Object *)V5_annotation);
  if (V5_leader != (ON_OBSOLETE_V5_Leader *)0x0) {
    pOVar2 = ON_Leader::CreateFromV5Leader(V5_leader,annotation_context,(ON_Leader *)0x0);
    return &pOVar2->super_ON_Annotation;
  }
  V5_dim_linear = ON_OBSOLETE_V5_DimLinear::Cast((ON_Object *)V5_annotation);
  if (V5_dim_linear != (ON_OBSOLETE_V5_DimLinear *)0x0) {
    pOVar3 = ON_DimLinear::CreateFromV5DimLinear
                       (V5_dim_linear,annotation_context,(ON_DimLinear *)0x0);
    return (ON_Annotation *)pOVar3;
  }
  V5_dim_angle = ON_OBSOLETE_V5_DimAngular::Cast((ON_Object *)V5_annotation);
  if (V5_dim_angle != (ON_OBSOLETE_V5_DimAngular *)0x0) {
    pOVar4 = ON_DimAngular::CreateFromV5DimAngular
                       (V5_dim_angle,annotation_context,(ON_DimAngular *)0x0);
    return (ON_Annotation *)pOVar4;
  }
  V5_radial_dimension = ON_OBSOLETE_V5_DimRadial::Cast((ON_Object *)V5_annotation);
  if (V5_radial_dimension != (ON_OBSOLETE_V5_DimRadial *)0x0) {
    pOVar5 = ON_DimRadial::CreateFromV5DimRadial
                       (V5_radial_dimension,annotation_context,(ON_DimRadial *)0x0);
    return (ON_Annotation *)pOVar5;
  }
  v5_dim_ordinate = ON_OBSOLETE_V5_DimOrdinate::Cast((ON_Object *)V5_annotation);
  if (v5_dim_ordinate != (ON_OBSOLETE_V5_DimOrdinate *)0x0) {
    pOVar6 = ON_DimOrdinate::CreateFromV5DimOrdinate
                       (v5_dim_ordinate,annotation_context,(ON_DimOrdinate *)0x0);
    return (ON_Annotation *)pOVar6;
  }
  return (ON_Annotation *)0x0;
}

Assistant:

ON_Annotation* ON_Annotation::CreateFromV5Annotation(
  const class ON_OBSOLETE_V5_Annotation& V5_annotation,
  const class ON_3dmAnnotationContext* annotation_context
)
{
  const ON_OBSOLETE_V5_TextObject* V5_text_object = ON_OBSOLETE_V5_TextObject::Cast(&V5_annotation);
  if (nullptr != V5_text_object)
    return ON_Text::CreateFromV5TextObject(*V5_text_object, annotation_context, nullptr);

  const ON_OBSOLETE_V5_Leader* V5_leader = ON_OBSOLETE_V5_Leader::Cast(&V5_annotation);
  if ( nullptr != V5_leader )
    return ON_Leader::CreateFromV5Leader(*V5_leader, annotation_context, nullptr);

  const ON_OBSOLETE_V5_DimLinear* V5_dim_linear = ON_OBSOLETE_V5_DimLinear::Cast(&V5_annotation);
  if ( nullptr != V5_dim_linear )
    return ON_DimLinear::CreateFromV5DimLinear(*V5_dim_linear, annotation_context, nullptr);

  const ON_OBSOLETE_V5_DimAngular* V5_dim_angle = ON_OBSOLETE_V5_DimAngular::Cast(&V5_annotation);
  if ( nullptr != V5_dim_angle )
    return ON_DimAngular::CreateFromV5DimAngular(*V5_dim_angle, annotation_context, nullptr);

  const ON_OBSOLETE_V5_DimRadial* V5_dim_radial = ON_OBSOLETE_V5_DimRadial::Cast(&V5_annotation);
  if ( nullptr != V5_dim_radial )
    return ON_DimRadial::CreateFromV5DimRadial(*V5_dim_radial, annotation_context, nullptr);
  
  const ON_OBSOLETE_V5_DimOrdinate* V5_dim_ordinate = ON_OBSOLETE_V5_DimOrdinate::Cast(&V5_annotation);
  if ( nullptr != V5_dim_ordinate )
    return ON_DimOrdinate::CreateFromV5DimOrdinate(*V5_dim_ordinate, annotation_context, nullptr);
  
  return nullptr;
}